

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Own<capnp::ClientHook> __thiscall
capnp::QueuedPipeline::getPipelinedCap(QueuedPipeline *this,ArrayPtr<const_capnp::PipelineOp> ops)

{
  undefined8 *firstElement;
  long lVar1;
  size_t in_RCX;
  size_t elementCount;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  Own<capnp::ClientHook> OVar3;
  ArrayBuilder<capnp::PipelineOp> copy;
  Array<capnp::PipelineOp> result;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  size_t sVar8;
  ClientHook *pCVar2;
  
  firstElement = (undefined8 *)
                 kj::_::HeapArrayDisposer::allocateImpl
                           (8,0,in_RCX,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  puVar6 = &kj::_::HeapArrayDisposer::instance;
  puVar7 = firstElement;
  if (in_RCX != 0) {
    lVar1 = 0;
    do {
      *puVar7 = *(undefined8 *)(ops.size_ + lVar1);
      puVar7 = puVar7 + 1;
      lVar1 = lVar1 + 8;
    } while (in_RCX << 3 != lVar1);
  }
  elementCount = (long)puVar7 - (long)firstElement >> 3;
  lVar1 = 0;
  lVar4 = 0;
  lVar5 = 0;
  OVar3 = getPipelinedCap(this,(Array<capnp::PipelineOp> *)ops.ptr);
  pCVar2 = OVar3.ptr;
  puVar7 = firstElement;
  sVar8 = elementCount;
  if (firstElement != (undefined8 *)0x0) {
    puVar7 = (undefined8 *)0x0;
    sVar8 = 0;
    kj::_::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,firstElement,8,elementCount,
               elementCount,(_func_void_void_ptr *)0x0);
    pCVar2 = extraout_RDX;
  }
  if (lVar1 != 0) {
    (**(code **)*puVar6)
              (puVar6,lVar1,8,lVar4 - lVar1 >> 3,lVar5 - lVar1 >> 3,0,0,0,0,puVar6,puVar7,sVar8);
    pCVar2 = extraout_RDX_00;
  }
  OVar3.ptr = pCVar2;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

kj::Own<ClientHook> getPipelinedCap(kj::ArrayPtr<const PipelineOp> ops) override {
    auto copy = kj::heapArrayBuilder<PipelineOp>(ops.size());
    for (auto& op: ops) {
      copy.add(op);
    }
    return getPipelinedCap(copy.finish());
  }